

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadZNodes(FileReader *dalump,DWORD id)

{
  undefined1 local_10a8 [8];
  FileReaderZ data;
  int local_18;
  bool compressed;
  int type;
  DWORD id_local;
  FileReader *dalump_local;
  
  if (id == 0x324c4758) {
    local_18 = 2;
    data.InBuff[0xfff] = '\0';
  }
  else if (id == 0x324c475a) {
    local_18 = 2;
    data.InBuff[0xfff] = '\x01';
  }
  else if (id == 0x334c4758) {
    local_18 = 3;
    data.InBuff[0xfff] = '\0';
  }
  else if (id == 0x334c475a) {
    local_18 = 3;
    data.InBuff[0xfff] = '\x01';
  }
  else if (id == 0x444f4e58) {
    local_18 = 0;
    data.InBuff[0xfff] = '\0';
  }
  else if (id == 0x444f4e5a) {
    local_18 = 0;
    data.InBuff[0xfff] = '\x01';
  }
  else if (id == 0x4e4c4758) {
    local_18 = 1;
    data.InBuff[0xfff] = '\0';
  }
  else {
    if (id != 0x4e4c475a) {
      return;
    }
    local_18 = 1;
    data.InBuff[0xfff] = '\x01';
  }
  if (data.InBuff[0xfff] == '\0') {
    LoadZNodes(&dalump->super_FileReaderBase,local_18);
  }
  else {
    FileReaderZ::FileReaderZ((FileReaderZ *)local_10a8,dalump,false);
    LoadZNodes((FileReaderBase *)local_10a8,local_18);
    FileReaderZ::~FileReaderZ((FileReaderZ *)local_10a8);
  }
  return;
}

Assistant:

void P_LoadZNodes (FileReader &dalump, DWORD id)
{
	int type;
	bool compressed;

	switch (id)
	{
	case MAKE_ID('Z','N','O','D'):
		type = 0;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','N'):
		type = 1;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','2'):
		type = 2;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','3'):
		type = 3;
		compressed = true;
		break;

	case MAKE_ID('X','N','O','D'):
		type = 0;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','N'):
		type = 1;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','2'):
		type = 2;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','3'):
		type = 3;
		compressed = false;
		break;

	default:
		return;
	}
	
	if (compressed)
	{
		FileReaderZ data (dalump);
		LoadZNodes(data, type);
	}
	else
	{
		LoadZNodes(dalump, type);
	}
}